

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O2

bool slang::ast::AssertionExpr::checkAssertionCall
               (CallExpression *call,ASTContext *context,DiagCode outArgCode,DiagCode refArgCode,
               optional<slang::DiagCode> sysTaskCode,SourceRange range)

{
  pointer ppEVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  variant_alternative_t<1UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *this;
  SystemSubroutine *pSVar5;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *ppSVar6;
  pointer ppFVar7;
  Symbol *this_00;
  VariableSymbol *pVVar8;
  Diagnostic *this_01;
  Diagnostic *this_02;
  SourceLocation noteLocation;
  ulong uVar9;
  long lVar10;
  ArgList AVar11;
  
  if (*(__index_type *)
       ((long)&(call->subroutine).
               super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
               .
               super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
               .
               super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
               .
               super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
               .
               super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
               .
               super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
       + 0x30) == '\x01') {
    this = std::
           get<1ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                     (&call->subroutine);
    pSVar5 = not_null<const_slang::ast::SystemSubroutine_*>::get(&this->subroutine);
    if (((uint6)sysTaskCode.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
                super__Optional_payload_base<slang::DiagCode> & 0x100000000) == 0 ||
        pSVar5->kind != Function) {
      if (pSVar5->hasOutputArgs != true) {
        return true;
      }
    }
    else {
      outArgCode = sysTaskCode.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
                   super__Optional_payload_base<slang::DiagCode>._M_payload;
    }
    ASTContext::addDiag(context,outArgCode,range);
LAB_00300970:
    bVar3 = false;
  }
  else {
    ppSVar6 = std::
              get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                        (&call->subroutine);
    ppEVar1 = (call->arguments_).data_;
    uVar2 = (call->arguments_).size_;
    AVar11 = SubroutineSymbol::getArguments(*ppSVar6);
    ppFVar7 = AVar11.data_;
    uVar9 = 0;
    for (lVar10 = AVar11.size_ << 3; lVar10 != 0; lVar10 = lVar10 + -8) {
      if (ppFVar7[uVar9]->direction == Ref) {
        if (uVar2 <= uVar9) {
          assert::assertFailed
                    ("index < args.size()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssertionExpr.cpp"
                     ,0x11e,
                     "static bool slang::ast::AssertionExpr::checkAssertionCall(const CallExpression &, const ASTContext &, DiagCode, DiagCode, std::optional<DiagCode>, SourceRange)"
                    );
        }
        this_00 = Expression::getSymbolReference(ppEVar1[uVar9],true);
        if ((((this_00 != (Symbol *)0x0) && (uVar4 = this_00->kind - Variable, uVar4 < 0x19)) &&
            ((0x1800c0fU >> (uVar4 & 0x1f) & 1) != 0)) &&
           (pVVar8 = Symbol::as<slang::ast::VariableSymbol>(this_00), pVVar8->lifetime == Automatic)
           ) {
          this_01 = ASTContext::addDiag(context,refArgCode,ppEVar1[uVar9]->sourceRange);
          this_02 = Diagnostic::operator<<(this_01,this_00->name);
          Diagnostic::operator<<
                    (this_02,(ppFVar7[uVar9]->super_VariableSymbol).super_ValueSymbol.super_Symbol.
                             name);
          noteLocation = this_00->location;
          goto LAB_00300966;
        }
      }
      else if (ppFVar7[uVar9]->direction - Out < 2) {
        this_01 = ASTContext::addDiag(context,outArgCode,range);
        noteLocation = (ppFVar7[uVar9]->super_VariableSymbol).super_ValueSymbol.super_Symbol.
                       location;
LAB_00300966:
        Diagnostic::addNote(this_01,(DiagCode)0x40001,noteLocation);
        goto LAB_00300970;
      }
      uVar9 = uVar9 + 1;
    }
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool AssertionExpr::checkAssertionCall(const CallExpression& call, const ASTContext& context,
                                       DiagCode outArgCode, DiagCode refArgCode,
                                       std::optional<DiagCode> sysTaskCode, SourceRange range) {
    if (call.isSystemCall()) {
        auto& sub = *std::get<1>(call.subroutine).subroutine;
        if (sub.kind == SubroutineKind::Function && sysTaskCode) {
            context.addDiag(*sysTaskCode, range);
            return false;
        }

        if (sub.hasOutputArgs) {
            context.addDiag(outArgCode, range);
            return false;
        }
    }
    else {
        auto& sub = *std::get<0>(call.subroutine);
        auto args = call.arguments();
        size_t index = 0;
        for (auto& formal : sub.getArguments()) {
            if (formal->direction == ArgumentDirection::Out ||
                formal->direction == ArgumentDirection::InOut) {
                auto& diag = context.addDiag(outArgCode, range);
                diag.addNote(diag::NoteDeclarationHere, formal->location);
                return false;
            }

            if (formal->direction == ArgumentDirection::Ref) {
                ASSERT(index < args.size());
                if (auto sym = args[index]->getSymbolReference()) {
                    if (VariableSymbol::isKind(sym->kind) &&
                        sym->as<VariableSymbol>().lifetime == VariableLifetime::Automatic) {
                        auto& diag = context.addDiag(refArgCode, args[index]->sourceRange);
                        diag << sym->name << formal->name;
                        diag.addNote(diag::NoteDeclarationHere, sym->location);
                        return false;
                    }
                }
            }

            index++;
        }
    }

    return true;
}